

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O3

void draw_left_brace(Fl_Widget *w)

{
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
            (fl_graphics_driver,(ulong)(w->x_ - 2),(ulong)(uint)w->y_,(ulong)(w->x_ + 6));
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
            (fl_graphics_driver,(ulong)(w->x_ - 2),(ulong)((w->h_ + w->y_) - 1),(ulong)(w->x_ + 6));
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
            (fl_graphics_driver,(ulong)(uint)w->x_,(ulong)(w->y_ - 2),(ulong)(w->h_ + w->y_ + 1));
  return;
}

Assistant:

static void draw_left_brace(const Fl_Widget *w) {
  fl_xyline(w->x()-2, w->y(), w->x()+6);
  fl_xyline(w->x()-2, w->y()+w->h()-1, w->x()+6);
  fl_yxline(w->x(), w->y()-2, w->y()+w->h()+1);
}